

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  Geometry *pGVar2;
  RTCIntersectArguments *pRVar3;
  RTCRayQueryContext *pRVar4;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 (*pauVar15) [16];
  byte bVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong in_R10;
  size_t mask;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_1338) [16];
  int local_131c;
  RTCFilterFunctionNArguments local_1318;
  ulong local_12e8;
  ulong local_12e0;
  long local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  ulong local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  ulong local_12a8;
  long local_12a0;
  Scene *local_1298;
  float local_1290;
  undefined4 local_128c;
  undefined4 local_1288;
  undefined4 local_1284;
  undefined4 local_1280;
  undefined4 local_127c;
  uint local_1278;
  uint local_1274;
  uint local_1270;
  undefined1 local_1260 [32];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  float local_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar27 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      aVar1 = (ray->super_RayK<1>).dir.field_0;
      auVar30 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar31 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx512vl((undefined1  [16])aVar1,auVar25);
      auVar26._8_4_ = 0x219392ef;
      auVar26._0_8_ = 0x219392ef219392ef;
      auVar26._12_4_ = 0x219392ef;
      uVar22 = vcmpps_avx512vl(auVar25,auVar26,1);
      auVar79._8_4_ = 0x3f800000;
      auVar79._0_8_ = &DAT_3f8000003f800000;
      auVar79._12_4_ = 0x3f800000;
      local_1338 = (undefined1 (*) [16])local_f90;
      auVar25 = vdivps_avx(auVar79,(undefined1  [16])aVar1);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar5 = (bool)((byte)uVar22 & 1);
      auVar27._0_4_ = (uint)bVar5 * auVar26._0_4_ | (uint)!bVar5 * auVar25._0_4_;
      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar5 * auVar26._4_4_ | (uint)!bVar5 * auVar25._4_4_;
      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * auVar25._8_4_;
      bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * auVar25._12_4_;
      auVar28._8_4_ = 0x3f7ffffa;
      auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar28._12_4_ = 0x3f7ffffa;
      auVar28 = vmulps_avx512vl(auVar27,auVar28);
      auVar29._8_4_ = 0x3f800003;
      auVar29._0_8_ = 0x3f8000033f800003;
      auVar29._12_4_ = 0x3f800003;
      auVar29 = vmulps_avx512vl(auVar27,auVar29);
      uVar77 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_11b0._4_4_ = uVar77;
      local_11b0._0_4_ = uVar77;
      local_11b0._8_4_ = uVar77;
      local_11b0._12_4_ = uVar77;
      auVar86 = ZEXT1664(local_11b0);
      uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_11c0._4_4_ = uVar77;
      local_11c0._0_4_ = uVar77;
      local_11c0._8_4_ = uVar77;
      local_11c0._12_4_ = uVar77;
      auVar87 = ZEXT1664(local_11c0);
      uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_11d0._4_4_ = uVar77;
      local_11d0._0_4_ = uVar77;
      local_11d0._8_4_ = uVar77;
      local_11d0._12_4_ = uVar77;
      auVar88 = ZEXT1664(local_11d0);
      local_11e0 = auVar28._0_4_;
      auVar25 = vmovshdup_avx(auVar28);
      local_11f0 = vshufps_avx(auVar28,auVar28,0x55);
      auVar93 = ZEXT1664(local_11f0);
      auVar26 = vshufpd_avx(auVar28,auVar28,1);
      local_1200 = vshufps_avx(auVar28,auVar28,0xaa);
      auVar94 = ZEXT1664(local_1200);
      local_1210 = auVar29._0_4_;
      local_1220 = vshufps_avx512vl(auVar29,auVar29,0x55);
      auVar99 = ZEXT1664(local_1220);
      local_1230 = vshufps_avx512vl(auVar29,auVar29,0xaa);
      auVar100 = ZEXT1664(local_1230);
      local_12a8 = (ulong)(local_11e0 < 0.0) << 4;
      local_12b0 = (ulong)(auVar25._0_4_ < 0.0) << 4 | 0x20;
      local_12b8 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x40;
      local_12c0 = local_12a8 ^ 0x10;
      local_12c8 = local_12b0 ^ 0x10;
      local_12d0 = local_12b8 ^ 0x10;
      local_1240 = vbroadcastss_avx512vl(auVar30);
      auVar101 = ZEXT1664(local_1240);
      uVar77 = auVar31._0_4_;
      auVar71 = ZEXT1664(CONCAT412(uVar77,CONCAT48(uVar77,CONCAT44(uVar77,uVar77))));
      fStack_11dc = local_11e0;
      fStack_11d8 = local_11e0;
      fStack_11d4 = local_11e0;
      fStack_120c = local_1210;
      fStack_1208 = local_1210;
      fStack_1204 = local_1210;
      fVar89 = local_11e0;
      fVar90 = local_11e0;
      fVar91 = local_11e0;
      fVar92 = local_11e0;
      fVar95 = local_1210;
      fVar96 = local_1210;
      fVar97 = local_1210;
      fVar98 = local_1210;
      do {
        do {
          do {
            if (local_1338 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar15 = local_1338 + -1;
            local_1338 = local_1338 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar15 + 8));
          uVar22 = *(ulong *)*local_1338;
          do {
            if ((uVar22 & 8) == 0) {
              auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12a8),auVar86._0_16_
                                  );
              auVar30._0_4_ = fVar89 * auVar25._0_4_;
              auVar30._4_4_ = fVar90 * auVar25._4_4_;
              auVar30._8_4_ = fVar91 * auVar25._8_4_;
              auVar30._12_4_ = fVar92 * auVar25._12_4_;
              auVar25 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12b0),auVar87._0_16_
                                  );
              auVar31._0_4_ = auVar93._0_4_ * auVar25._0_4_;
              auVar31._4_4_ = auVar93._4_4_ * auVar25._4_4_;
              auVar31._8_4_ = auVar93._8_4_ * auVar25._8_4_;
              auVar31._12_4_ = auVar93._12_4_ * auVar25._12_4_;
              auVar25 = vmaxps_avx(auVar30,auVar31);
              auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12b8),auVar88._0_16_
                                  );
              auVar73._0_4_ = auVar94._0_4_ * auVar30._0_4_;
              auVar73._4_4_ = auVar94._4_4_ * auVar30._4_4_;
              auVar73._8_4_ = auVar94._8_4_ * auVar30._8_4_;
              auVar73._12_4_ = auVar94._12_4_ * auVar30._12_4_;
              auVar30 = vmaxps_avx512vl(auVar73,auVar101._0_16_);
              auVar25 = vmaxps_avx(auVar25,auVar30);
              auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12c0),auVar86._0_16_
                                  );
              auVar74._0_4_ = fVar95 * auVar30._0_4_;
              auVar74._4_4_ = fVar96 * auVar30._4_4_;
              auVar74._8_4_ = fVar97 * auVar30._8_4_;
              auVar74._12_4_ = fVar98 * auVar30._12_4_;
              auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12c8),auVar87._0_16_
                                  );
              auVar30 = vmulps_avx512vl(auVar99._0_16_,auVar30);
              auVar30 = vminps_avx(auVar74,auVar30);
              auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12d0),auVar88._0_16_
                                  );
              auVar31 = vmulps_avx512vl(auVar100._0_16_,auVar31);
              auVar31 = vminps_avx(auVar31,auVar71._0_16_);
              auVar30 = vminps_avx(auVar30,auVar31);
              uVar7 = vcmpps_avx512vl(auVar25,auVar30,2);
              in_R10 = CONCAT44((int)(in_R10 >> 0x20),(uint)(byte)uVar7);
              local_1180._0_16_ = auVar25;
            }
            if ((uVar22 & 8) == 0) {
              if (in_R10 == 0) {
                iVar17 = 4;
              }
              else {
                uVar21 = uVar22 & 0xfffffffffffffff0;
                lVar23 = 0;
                for (uVar22 = in_R10; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  lVar23 = lVar23 + 1;
                }
                iVar17 = 0;
                uVar20 = in_R10 - 1 & in_R10;
                uVar22 = *(ulong *)(uVar21 + lVar23 * 8);
                if (uVar20 != 0) {
                  uVar24 = *(uint *)(local_1180 + lVar23 * 4);
                  lVar23 = 0;
                  for (uVar9 = uVar20; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                    lVar23 = lVar23 + 1;
                  }
                  uVar20 = uVar20 - 1 & uVar20;
                  uVar9 = *(ulong *)(uVar21 + lVar23 * 8);
                  uVar19 = *(uint *)(local_1180 + lVar23 * 4);
                  if (uVar20 == 0) {
                    if (uVar24 < uVar19) {
                      *(ulong *)*local_1338 = uVar9;
                      *(uint *)((long)*local_1338 + 8) = uVar19;
                      local_1338 = local_1338 + 1;
                    }
                    else {
                      *(ulong *)*local_1338 = uVar22;
                      *(uint *)((long)*local_1338 + 8) = uVar24;
                      uVar22 = uVar9;
                      local_1338 = local_1338 + 1;
                    }
                  }
                  else {
                    auVar72._8_8_ = 0;
                    auVar72._0_8_ = uVar22;
                    auVar25 = vpunpcklqdq_avx(auVar72,ZEXT416(uVar24));
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar9;
                    auVar30 = vpunpcklqdq_avx(auVar75,ZEXT416(uVar19));
                    lVar23 = 0;
                    for (uVar22 = uVar20; (uVar22 & 1) == 0;
                        uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                      lVar23 = lVar23 + 1;
                    }
                    uVar20 = uVar20 - 1 & uVar20;
                    auVar76._8_8_ = 0;
                    auVar76._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                    auVar29 = vpunpcklqdq_avx(auVar76,ZEXT416(*(uint *)(local_1180 + lVar23 * 4)));
                    auVar31 = vpshufd_avx(auVar25,0xaa);
                    auVar26 = vpshufd_avx(auVar30,0xaa);
                    auVar28 = vpshufd_avx(auVar29,0xaa);
                    iVar17 = 0;
                    if (uVar20 == 0) {
                      uVar22 = vpcmpgtd_avx512vl(auVar26,auVar31);
                      uVar22 = uVar22 & 0xf;
                      auVar26 = vpblendmd_avx512vl(auVar30,auVar25);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar32._0_4_ = (uint)bVar5 * auVar26._0_4_ | (uint)!bVar5 * auVar31._0_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar32._4_4_ = (uint)bVar5 * auVar26._4_4_ | (uint)!bVar5 * auVar31._4_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar32._8_4_ = (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * auVar31._8_4_;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar32._12_4_ = (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * auVar31._12_4_;
                      auVar30 = vmovdqa32_avx512vl(auVar30);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar33._0_4_ = (uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * auVar25._0_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar33._4_4_ = (uint)bVar5 * auVar30._4_4_ | (uint)!bVar5 * auVar25._4_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar33._8_4_ = (uint)bVar5 * auVar30._8_4_ | (uint)!bVar5 * auVar25._8_4_;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar33._12_4_ = (uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * auVar25._12_4_;
                      auVar25 = vpshufd_avx(auVar32,0xaa);
                      uVar21 = vpcmpgtd_avx512vl(auVar28,auVar25);
                      uVar21 = uVar21 & 0xf;
                      auVar30 = vpblendmd_avx512vl(auVar29,auVar32);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
                      uVar22 = CONCAT44((uint)bVar6 * auVar30._4_4_ | (uint)!bVar6 * auVar25._4_4_,
                                        (uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * auVar25._0_4_);
                      auVar25 = vmovdqa32_avx512vl(auVar29);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      auVar34._0_4_ = (uint)bVar5 * auVar25._0_4_ | !bVar5 * auVar32._0_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
                      auVar34._4_4_ = (uint)bVar5 * auVar25._4_4_ | !bVar5 * auVar32._4_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
                      auVar34._8_4_ = (uint)bVar5 * auVar25._8_4_ | !bVar5 * auVar32._8_4_;
                      bVar5 = SUB81(uVar21 >> 3,0);
                      auVar34._12_4_ = (uint)bVar5 * auVar25._12_4_ | !bVar5 * auVar32._12_4_;
                      auVar25 = vpshufd_avx(auVar34,0xaa);
                      auVar30 = vpshufd_avx(auVar33,0xaa);
                      uVar21 = vpcmpgtd_avx512vl(auVar25,auVar30);
                      uVar21 = uVar21 & 0xf;
                      auVar30 = vpblendmd_avx512vl(auVar34,auVar33);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      auVar35._0_4_ = (uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * auVar25._0_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
                      auVar35._4_4_ = (uint)bVar5 * auVar30._4_4_ | (uint)!bVar5 * auVar25._4_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
                      auVar35._8_4_ = (uint)bVar5 * auVar30._8_4_ | (uint)!bVar5 * auVar25._8_4_;
                      bVar5 = SUB81(uVar21 >> 3,0);
                      auVar35._12_4_ = (uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * auVar25._12_4_;
                      auVar25 = vmovdqa32_avx512vl(auVar34);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      auVar36._0_4_ = (uint)bVar5 * auVar25._0_4_ | !bVar5 * auVar33._0_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
                      auVar36._4_4_ = (uint)bVar5 * auVar25._4_4_ | !bVar5 * auVar33._4_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
                      auVar36._8_4_ = (uint)bVar5 * auVar25._8_4_ | !bVar5 * auVar33._8_4_;
                      bVar5 = SUB81(uVar21 >> 3,0);
                      auVar36._12_4_ = (uint)bVar5 * auVar25._12_4_ | !bVar5 * auVar33._12_4_;
                      *local_1338 = auVar36;
                      local_1338[1] = auVar35;
                      local_1338 = local_1338 + 2;
                    }
                    else {
                      lVar23 = 0;
                      for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                        lVar23 = lVar23 + 1;
                      }
                      uVar24 = *(uint *)(local_1180 + lVar23 * 4);
                      auVar82._8_8_ = 0;
                      auVar82._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                      auVar27 = vpunpcklqdq_avx(auVar82,ZEXT416(uVar24));
                      uVar22 = vpcmpgtd_avx512vl(auVar26,auVar31);
                      uVar22 = uVar22 & 0xf;
                      auVar26 = vpblendmd_avx512vl(auVar30,auVar25);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar37._0_4_ = (uint)bVar5 * auVar26._0_4_ | (uint)!bVar5 * auVar31._0_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar37._4_4_ = (uint)bVar5 * auVar26._4_4_ | (uint)!bVar5 * auVar31._4_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar37._8_4_ = (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * auVar31._8_4_;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar37._12_4_ = (uint)bVar5 * auVar26._12_4_ | (uint)!bVar5 * auVar31._12_4_;
                      auVar30 = vmovdqa32_avx512vl(auVar30);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar38._0_4_ = (uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * auVar25._0_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar38._4_4_ = (uint)bVar5 * auVar30._4_4_ | (uint)!bVar5 * auVar25._4_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar38._8_4_ = (uint)bVar5 * auVar30._8_4_ | (uint)!bVar5 * auVar25._8_4_;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar38._12_4_ = (uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * auVar25._12_4_;
                      auVar78._4_4_ = uVar24;
                      auVar78._0_4_ = uVar24;
                      auVar78._8_4_ = uVar24;
                      auVar78._12_4_ = uVar24;
                      uVar22 = vpcmpgtd_avx512vl(auVar78,auVar28);
                      uVar22 = uVar22 & 0xf;
                      auVar25 = vpblendmd_avx512vl(auVar27,auVar29);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar39._0_4_ = (uint)bVar5 * auVar25._0_4_ | !bVar5 * uVar24;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar39._4_4_ = (uint)bVar5 * auVar25._4_4_ | !bVar5 * uVar24;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar39._8_4_ = (uint)bVar5 * auVar25._8_4_ | !bVar5 * uVar24;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar39._12_4_ = (uint)bVar5 * auVar25._12_4_ | !bVar5 * uVar24;
                      auVar25 = vmovdqa32_avx512vl(auVar27);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar40._0_4_ = (uint)bVar5 * auVar25._0_4_ | (uint)!bVar5 * auVar29._0_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar40._4_4_ = (uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * auVar29._4_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar40._8_4_ = (uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * auVar29._8_4_;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar40._12_4_ = (uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * auVar29._12_4_;
                      auVar25 = vpshufd_avx(auVar40,0xaa);
                      auVar30 = vpshufd_avx(auVar38,0xaa);
                      uVar22 = vpcmpgtd_avx512vl(auVar25,auVar30);
                      uVar22 = uVar22 & 0xf;
                      auVar30 = vpblendmd_avx512vl(auVar40,auVar38);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar41._0_4_ = (uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * auVar25._0_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar41._4_4_ = (uint)bVar5 * auVar30._4_4_ | (uint)!bVar5 * auVar25._4_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar41._8_4_ = (uint)bVar5 * auVar30._8_4_ | (uint)!bVar5 * auVar25._8_4_;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar41._12_4_ = (uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * auVar25._12_4_;
                      auVar25 = vmovdqa32_avx512vl(auVar40);
                      bVar5 = (bool)((byte)uVar22 & 1);
                      auVar42._0_4_ = (uint)bVar5 * auVar25._0_4_ | !bVar5 * auVar38._0_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
                      auVar42._4_4_ = (uint)bVar5 * auVar25._4_4_ | !bVar5 * auVar38._4_4_;
                      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
                      auVar42._8_4_ = (uint)bVar5 * auVar25._8_4_ | !bVar5 * auVar38._8_4_;
                      bVar5 = SUB81(uVar22 >> 3,0);
                      auVar42._12_4_ = (uint)bVar5 * auVar25._12_4_ | !bVar5 * auVar38._12_4_;
                      auVar25 = vpshufd_avx(auVar39,0xaa);
                      auVar30 = vpshufd_avx(auVar37,0xaa);
                      uVar21 = vpcmpgtd_avx512vl(auVar25,auVar30);
                      uVar21 = uVar21 & 0xf;
                      auVar30 = vpblendmd_avx512vl(auVar39,auVar37);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
                      uVar22 = CONCAT44((uint)bVar6 * auVar30._4_4_ | (uint)!bVar6 * auVar25._4_4_,
                                        (uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * auVar25._0_4_);
                      auVar25 = vmovdqa32_avx512vl(auVar39);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      auVar43._0_4_ = (uint)bVar5 * auVar25._0_4_ | !bVar5 * auVar37._0_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
                      auVar43._4_4_ = (uint)bVar5 * auVar25._4_4_ | !bVar5 * auVar37._4_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
                      auVar43._8_4_ = (uint)bVar5 * auVar25._8_4_ | !bVar5 * auVar37._8_4_;
                      bVar5 = SUB81(uVar21 >> 3,0);
                      auVar43._12_4_ = (uint)bVar5 * auVar25._12_4_ | !bVar5 * auVar37._12_4_;
                      auVar25 = vpshufd_avx(auVar43,0xaa);
                      auVar30 = vpshufd_avx(auVar41,0xaa);
                      uVar21 = vpcmpgtd_avx512vl(auVar30,auVar25);
                      uVar21 = uVar21 & 0xf;
                      auVar30 = vpblendmd_avx512vl(auVar41,auVar43);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      auVar44._0_4_ = (uint)bVar5 * auVar30._0_4_ | (uint)!bVar5 * auVar25._0_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
                      auVar44._4_4_ = (uint)bVar5 * auVar30._4_4_ | (uint)!bVar5 * auVar25._4_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
                      auVar44._8_4_ = (uint)bVar5 * auVar30._8_4_ | (uint)!bVar5 * auVar25._8_4_;
                      bVar5 = SUB81(uVar21 >> 3,0);
                      auVar44._12_4_ = (uint)bVar5 * auVar30._12_4_ | (uint)!bVar5 * auVar25._12_4_;
                      auVar25 = vmovdqa32_avx512vl(auVar41);
                      bVar5 = (bool)((byte)uVar21 & 1);
                      auVar45._0_4_ = (uint)bVar5 * auVar25._0_4_ | !bVar5 * auVar43._0_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
                      auVar45._4_4_ = (uint)bVar5 * auVar25._4_4_ | !bVar5 * auVar43._4_4_;
                      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
                      auVar45._8_4_ = (uint)bVar5 * auVar25._8_4_ | !bVar5 * auVar43._8_4_;
                      bVar5 = SUB81(uVar21 >> 3,0);
                      auVar45._12_4_ = (uint)bVar5 * auVar25._12_4_ | !bVar5 * auVar43._12_4_;
                      *local_1338 = auVar42;
                      local_1338[1] = auVar45;
                      local_1338[2] = auVar44;
                      local_1338 = local_1338 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar17 = 6;
            }
          } while (iVar17 == 0);
        } while (iVar17 != 6);
        local_12d8 = (ulong)((uint)uVar22 & 0xf) - 8;
        if (local_12d8 != 0) {
          uVar22 = uVar22 & 0xfffffffffffffff0;
          local_12a0 = 0;
          local_12e0 = in_R10;
          local_12e8 = uVar22;
          do {
            lVar18 = local_12a0 * 0xe0;
            lVar23 = uVar22 + 0xd0 + lVar18;
            local_11a0 = *(undefined8 *)(lVar23 + 0x10);
            uStack_1198 = *(undefined8 *)(lVar23 + 0x18);
            lVar23 = uVar22 + 0xc0 + lVar18;
            local_fc0 = *(undefined8 *)(lVar23 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar23 + 0x18);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            uStack_1190 = local_11a0;
            uStack_1188 = uStack_1198;
            auVar68._16_16_ = *(undefined1 (*) [16])(uVar22 + 0x60 + lVar18);
            auVar68._0_16_ = *(undefined1 (*) [16])(uVar22 + lVar18);
            auVar48._16_16_ = *(undefined1 (*) [16])(uVar22 + 0x70 + lVar18);
            auVar48._0_16_ = *(undefined1 (*) [16])(uVar22 + 0x10 + lVar18);
            auVar49._16_16_ = *(undefined1 (*) [16])(uVar22 + 0x80 + lVar18);
            auVar49._0_16_ = *(undefined1 (*) [16])(uVar22 + 0x20 + lVar18);
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0x30 + lVar18);
            auVar53._16_16_ = auVar25;
            auVar53._0_16_ = auVar25;
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0x40 + lVar18);
            auVar54._16_16_ = auVar25;
            auVar54._0_16_ = auVar25;
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0x50 + lVar18);
            auVar55._16_16_ = auVar25;
            auVar55._0_16_ = auVar25;
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0x90 + lVar18);
            auVar56._16_16_ = auVar25;
            auVar56._0_16_ = auVar25;
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0xa0 + lVar18);
            auVar57._16_16_ = auVar25;
            auVar57._0_16_ = auVar25;
            auVar25 = *(undefined1 (*) [16])(uVar22 + 0xb0 + lVar18);
            auVar58._16_16_ = auVar25;
            auVar58._0_16_ = auVar25;
            uVar77 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar59._4_4_ = uVar77;
            auVar59._0_4_ = uVar77;
            auVar59._8_4_ = uVar77;
            auVar59._12_4_ = uVar77;
            auVar59._16_4_ = uVar77;
            auVar59._20_4_ = uVar77;
            auVar59._24_4_ = uVar77;
            auVar59._28_4_ = uVar77;
            auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar77 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar80._4_4_ = uVar77;
            auVar80._0_4_ = uVar77;
            auVar80._8_4_ = uVar77;
            auVar80._12_4_ = uVar77;
            auVar80._16_4_ = uVar77;
            auVar80._20_4_ = uVar77;
            auVar80._24_4_ = uVar77;
            auVar80._28_4_ = uVar77;
            uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar83._4_4_ = uVar77;
            auVar83._0_4_ = uVar77;
            auVar83._8_4_ = uVar77;
            auVar83._12_4_ = uVar77;
            auVar83._16_4_ = uVar77;
            auVar83._20_4_ = uVar77;
            auVar83._24_4_ = uVar77;
            auVar83._28_4_ = uVar77;
            fVar89 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar85._4_4_ = fVar89;
            auVar85._0_4_ = fVar89;
            auVar85._8_4_ = fVar89;
            auVar85._12_4_ = fVar89;
            auVar85._16_4_ = fVar89;
            auVar85._20_4_ = fVar89;
            auVar85._24_4_ = fVar89;
            auVar85._28_4_ = fVar89;
            auVar68 = vsubps_avx(auVar68,auVar59);
            auVar48 = vsubps_avx512vl(auVar48,auVar46);
            auVar49 = vsubps_avx512vl(auVar49,auVar47);
            auVar50 = vsubps_avx512vl(auVar53,auVar59);
            auVar51 = vsubps_avx512vl(auVar54,auVar46);
            auVar52 = vsubps_avx512vl(auVar55,auVar47);
            auVar53 = vsubps_avx512vl(auVar56,auVar59);
            auVar54 = vsubps_avx512vl(auVar57,auVar46);
            auVar47 = vsubps_avx512vl(auVar58,auVar47);
            auVar55 = vsubps_avx512vl(auVar53,auVar68);
            auVar56 = vsubps_avx512vl(auVar54,auVar48);
            auVar46 = vsubps_avx(auVar47,auVar49);
            auVar57 = vsubps_avx512vl(auVar68,auVar50);
            auVar58 = vsubps_avx512vl(auVar48,auVar51);
            auVar59 = vsubps_avx512vl(auVar49,auVar52);
            auVar60 = vsubps_avx512vl(auVar50,auVar53);
            auVar61 = vsubps_avx512vl(auVar51,auVar54);
            auVar62 = vsubps_avx512vl(auVar52,auVar47);
            auVar63 = vaddps_avx512vl(auVar53,auVar68);
            auVar64 = vaddps_avx512vl(auVar54,auVar48);
            auVar65 = vaddps_avx512vl(auVar47,auVar49);
            auVar66 = vmulps_avx512vl(auVar64,auVar46);
            auVar66 = vfmsub231ps_avx512vl(auVar66,auVar56,auVar65);
            auVar65 = vmulps_avx512vl(auVar65,auVar55);
            auVar67 = vfmsub231ps_avx512vl(auVar65,auVar46,auVar63);
            auVar65._4_4_ = auVar56._4_4_ * auVar63._4_4_;
            auVar65._0_4_ = auVar56._0_4_ * auVar63._0_4_;
            auVar65._8_4_ = auVar56._8_4_ * auVar63._8_4_;
            auVar65._12_4_ = auVar56._12_4_ * auVar63._12_4_;
            auVar65._16_4_ = auVar56._16_4_ * auVar63._16_4_;
            auVar65._20_4_ = auVar56._20_4_ * auVar63._20_4_;
            auVar65._24_4_ = auVar56._24_4_ * auVar63._24_4_;
            auVar65._28_4_ = auVar63._28_4_;
            auVar25 = vfmsub231ps_fma(auVar65,auVar55,auVar64);
            auVar64._0_4_ = fVar89 * auVar25._0_4_;
            auVar64._4_4_ = fVar89 * auVar25._4_4_;
            auVar64._8_4_ = fVar89 * auVar25._8_4_;
            auVar64._12_4_ = fVar89 * auVar25._12_4_;
            auVar64._16_4_ = fVar89 * 0.0;
            auVar64._20_4_ = fVar89 * 0.0;
            auVar64._24_4_ = fVar89 * 0.0;
            auVar64._28_4_ = 0;
            auVar65 = vfmadd231ps_avx512vl(auVar64,auVar83,auVar67);
            auVar65 = vfmadd231ps_avx512vl(auVar65,auVar80,auVar66);
            auVar63 = vaddps_avx512vl(auVar68,auVar50);
            auVar64 = vaddps_avx512vl(auVar48,auVar51);
            auVar66 = vaddps_avx512vl(auVar49,auVar52);
            auVar67 = vmulps_avx512vl(auVar64,auVar59);
            auVar67 = vfmsub231ps_avx512vl(auVar67,auVar58,auVar66);
            auVar66 = vmulps_avx512vl(auVar66,auVar57);
            auVar66 = vfmsub231ps_avx512vl(auVar66,auVar59,auVar63);
            auVar63 = vmulps_avx512vl(auVar63,auVar58);
            auVar64 = vfmsub231ps_avx512vl(auVar63,auVar57,auVar64);
            auVar63._4_4_ = fVar89 * auVar64._4_4_;
            auVar63._0_4_ = fVar89 * auVar64._0_4_;
            auVar63._8_4_ = fVar89 * auVar64._8_4_;
            auVar63._12_4_ = fVar89 * auVar64._12_4_;
            auVar63._16_4_ = fVar89 * auVar64._16_4_;
            auVar63._20_4_ = fVar89 * auVar64._20_4_;
            auVar63._24_4_ = fVar89 * auVar64._24_4_;
            auVar63._28_4_ = auVar64._28_4_;
            auVar63 = vfmadd231ps_avx512vl(auVar63,auVar83,auVar66);
            local_1160 = vfmadd231ps_avx512vl(auVar63,auVar80,auVar67);
            auVar50 = vaddps_avx512vl(auVar50,auVar53);
            auVar51 = vaddps_avx512vl(auVar51,auVar54);
            auVar47 = vaddps_avx512vl(auVar52,auVar47);
            auVar63 = vmulps_avx512vl(auVar51,auVar62);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar61,auVar47);
            auVar52._4_4_ = auVar47._4_4_ * auVar60._4_4_;
            auVar52._0_4_ = auVar47._0_4_ * auVar60._0_4_;
            auVar52._8_4_ = auVar47._8_4_ * auVar60._8_4_;
            auVar52._12_4_ = auVar47._12_4_ * auVar60._12_4_;
            auVar52._16_4_ = auVar47._16_4_ * auVar60._16_4_;
            auVar52._20_4_ = auVar47._20_4_ * auVar60._20_4_;
            auVar52._24_4_ = auVar47._24_4_ * auVar60._24_4_;
            auVar52._28_4_ = auVar47._28_4_;
            auVar47 = vfmsub231ps_avx512vl(auVar52,auVar62,auVar50);
            auVar50 = vmulps_avx512vl(auVar50,auVar61);
            auVar50 = vfmsub231ps_avx512vl(auVar50,auVar60,auVar51);
            auVar50 = vmulps_avx512vl(auVar85,auVar50);
            auVar47 = vfmadd231ps_avx512vl(auVar50,auVar83,auVar47);
            auVar63 = vfmadd231ps_avx512vl(auVar47,auVar80,auVar63);
            auVar66._0_4_ = local_1160._0_4_ + auVar65._0_4_;
            auVar66._4_4_ = local_1160._4_4_ + auVar65._4_4_;
            auVar66._8_4_ = local_1160._8_4_ + auVar65._8_4_;
            auVar66._12_4_ = local_1160._12_4_ + auVar65._12_4_;
            auVar66._16_4_ = local_1160._16_4_ + auVar65._16_4_;
            auVar66._20_4_ = local_1160._20_4_ + auVar65._20_4_;
            auVar66._24_4_ = local_1160._24_4_ + auVar65._24_4_;
            auVar66._28_4_ = local_1160._28_4_ + auVar65._28_4_;
            local_1140 = vaddps_avx512vl(auVar63,auVar66);
            auVar47._8_4_ = 0x7fffffff;
            auVar47._0_8_ = 0x7fffffff7fffffff;
            auVar47._12_4_ = 0x7fffffff;
            auVar47._16_4_ = 0x7fffffff;
            auVar47._20_4_ = 0x7fffffff;
            auVar47._24_4_ = 0x7fffffff;
            auVar47._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_1140,auVar47);
            auVar50._8_4_ = 0x34000000;
            auVar50._0_8_ = 0x3400000034000000;
            auVar50._12_4_ = 0x34000000;
            auVar50._16_4_ = 0x34000000;
            auVar50._20_4_ = 0x34000000;
            auVar50._24_4_ = 0x34000000;
            auVar50._28_4_ = 0x34000000;
            auVar47 = vmulps_avx512vl(local_1140,auVar50);
            auVar50 = vminps_avx512vl(auVar65,local_1160);
            auVar50 = vminps_avx512vl(auVar50,auVar63);
            auVar51._8_4_ = 0x80000000;
            auVar51._0_8_ = 0x8000000080000000;
            auVar51._12_4_ = 0x80000000;
            auVar51._16_4_ = 0x80000000;
            auVar51._20_4_ = 0x80000000;
            auVar51._24_4_ = 0x80000000;
            auVar51._28_4_ = 0x80000000;
            auVar51 = vxorps_avx512vl(auVar47,auVar51);
            uVar7 = vcmpps_avx512vl(auVar50,auVar51,5);
            auVar50 = vmaxps_avx512vl(auVar65,local_1160);
            auVar50 = vmaxps_avx512vl(auVar50,auVar63);
            uVar8 = vcmpps_avx512vl(auVar50,auVar47,2);
            local_10c0 = (byte)uVar7 | (byte)uVar8;
            if (local_10c0 != 0) {
              auVar47 = vmulps_avx512vl(auVar46,auVar58);
              auVar50 = vmulps_avx512vl(auVar55,auVar59);
              auVar51 = vmulps_avx512vl(auVar56,auVar57);
              auVar63 = vmulps_avx512vl(auVar59,auVar61);
              auVar52 = vmulps_avx512vl(auVar57,auVar62);
              auVar53 = vmulps_avx512vl(auVar58,auVar60);
              auVar54 = vfmsub213ps_avx512vl(auVar56,auVar59,auVar47);
              auVar46 = vfmsub213ps_avx512vl(auVar46,auVar57,auVar50);
              auVar55 = vfmsub213ps_avx512vl(auVar55,auVar58,auVar51);
              auVar56 = vfmsub213ps_avx512vl(auVar62,auVar58,auVar63);
              auVar58 = vfmsub213ps_avx512vl(auVar60,auVar59,auVar52);
              auVar57 = vfmsub213ps_avx512vl(auVar61,auVar57,auVar53);
              auVar59 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(auVar47,auVar59);
              vandps_avx512vl(auVar63,auVar59);
              uVar21 = vcmpps_avx512vl(auVar59,auVar59,1);
              vandps_avx512vl(auVar50,auVar59);
              vandps_avx512vl(auVar52,auVar59);
              uVar20 = vcmpps_avx512vl(auVar59,auVar59,1);
              vandps_avx512vl(auVar51,auVar59);
              vandps_avx512vl(auVar53,auVar59);
              uVar9 = vcmpps_avx512vl(auVar59,auVar59,1);
              bVar5 = (bool)((byte)uVar21 & 1);
              local_1120._0_4_ = (float)((uint)bVar5 * auVar54._0_4_ | (uint)!bVar5 * auVar56._0_4_)
              ;
              bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
              local_1120._4_4_ = (float)((uint)bVar5 * auVar54._4_4_ | (uint)!bVar5 * auVar56._4_4_)
              ;
              bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
              local_1120._8_4_ = (float)((uint)bVar5 * auVar54._8_4_ | (uint)!bVar5 * auVar56._8_4_)
              ;
              bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
              local_1120._12_4_ =
                   (float)((uint)bVar5 * auVar54._12_4_ | (uint)!bVar5 * auVar56._12_4_);
              bVar5 = (bool)((byte)(uVar21 >> 4) & 1);
              local_1120._16_4_ =
                   (float)((uint)bVar5 * auVar54._16_4_ | (uint)!bVar5 * auVar56._16_4_);
              bVar5 = (bool)((byte)(uVar21 >> 5) & 1);
              local_1120._20_4_ =
                   (float)((uint)bVar5 * auVar54._20_4_ | (uint)!bVar5 * auVar56._20_4_);
              bVar5 = (bool)((byte)(uVar21 >> 6) & 1);
              local_1120._24_4_ =
                   (float)((uint)bVar5 * auVar54._24_4_ | (uint)!bVar5 * auVar56._24_4_);
              bVar5 = SUB81(uVar21 >> 7,0);
              local_1120._28_4_ = (uint)bVar5 * auVar54._28_4_ | (uint)!bVar5 * auVar56._28_4_;
              bVar5 = (bool)((byte)uVar20 & 1);
              local_1100._0_4_ = (float)((uint)bVar5 * auVar46._0_4_ | (uint)!bVar5 * auVar58._0_4_)
              ;
              bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
              local_1100._4_4_ = (float)((uint)bVar5 * auVar46._4_4_ | (uint)!bVar5 * auVar58._4_4_)
              ;
              bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
              local_1100._8_4_ = (float)((uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * auVar58._8_4_)
              ;
              bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
              local_1100._12_4_ =
                   (float)((uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * auVar58._12_4_);
              bVar5 = (bool)((byte)(uVar20 >> 4) & 1);
              local_1100._16_4_ =
                   (float)((uint)bVar5 * auVar46._16_4_ | (uint)!bVar5 * auVar58._16_4_);
              bVar5 = (bool)((byte)(uVar20 >> 5) & 1);
              local_1100._20_4_ =
                   (float)((uint)bVar5 * auVar46._20_4_ | (uint)!bVar5 * auVar58._20_4_);
              bVar5 = (bool)((byte)(uVar20 >> 6) & 1);
              local_1100._24_4_ =
                   (float)((uint)bVar5 * auVar46._24_4_ | (uint)!bVar5 * auVar58._24_4_);
              bVar5 = SUB81(uVar20 >> 7,0);
              local_1100._28_4_ = (uint)bVar5 * auVar46._28_4_ | (uint)!bVar5 * auVar58._28_4_;
              bVar5 = (bool)((byte)uVar9 & 1);
              local_10e0 = (float)((uint)bVar5 * auVar55._0_4_ | (uint)!bVar5 * auVar57._0_4_);
              bVar5 = (bool)((byte)(uVar9 >> 1) & 1);
              fStack_10dc = (float)((uint)bVar5 * auVar55._4_4_ | (uint)!bVar5 * auVar57._4_4_);
              bVar5 = (bool)((byte)(uVar9 >> 2) & 1);
              fStack_10d8 = (float)((uint)bVar5 * auVar55._8_4_ | (uint)!bVar5 * auVar57._8_4_);
              bVar5 = (bool)((byte)(uVar9 >> 3) & 1);
              fStack_10d4 = (float)((uint)bVar5 * auVar55._12_4_ | (uint)!bVar5 * auVar57._12_4_);
              bVar5 = (bool)((byte)(uVar9 >> 4) & 1);
              fStack_10d0 = (float)((uint)bVar5 * auVar55._16_4_ | (uint)!bVar5 * auVar57._16_4_);
              bVar5 = (bool)((byte)(uVar9 >> 5) & 1);
              fStack_10cc = (float)((uint)bVar5 * auVar55._20_4_ | (uint)!bVar5 * auVar57._20_4_);
              bVar5 = (bool)((byte)(uVar9 >> 6) & 1);
              fStack_10c8 = (float)((uint)bVar5 * auVar55._24_4_ | (uint)!bVar5 * auVar57._24_4_);
              bVar5 = SUB81(uVar9 >> 7,0);
              uStack_10c4 = (uint)bVar5 * auVar55._28_4_ | (uint)!bVar5 * auVar57._28_4_;
              auVar67._4_4_ = fVar89 * fStack_10dc;
              auVar67._0_4_ = fVar89 * local_10e0;
              auVar67._8_4_ = fVar89 * fStack_10d8;
              auVar67._12_4_ = fVar89 * fStack_10d4;
              auVar67._16_4_ = fVar89 * fStack_10d0;
              auVar67._20_4_ = fVar89 * fStack_10cc;
              auVar67._24_4_ = fVar89 * fStack_10c8;
              auVar67._28_4_ = fVar89;
              auVar25 = vfmadd213ps_fma(auVar83,local_1100,auVar67);
              auVar25 = vfmadd213ps_fma(auVar80,local_1120,ZEXT1632(auVar25));
              auVar47 = ZEXT1632(CONCAT412(auVar25._12_4_ + auVar25._12_4_,
                                           CONCAT48(auVar25._8_4_ + auVar25._8_4_,
                                                    CONCAT44(auVar25._4_4_ + auVar25._4_4_,
                                                             auVar25._0_4_ + auVar25._0_4_))));
              auVar84._0_4_ = auVar49._0_4_ * local_10e0;
              auVar84._4_4_ = auVar49._4_4_ * fStack_10dc;
              auVar84._8_4_ = auVar49._8_4_ * fStack_10d8;
              auVar84._12_4_ = auVar49._12_4_ * fStack_10d4;
              auVar84._16_4_ = auVar49._16_4_ * fStack_10d0;
              auVar84._20_4_ = auVar49._20_4_ * fStack_10cc;
              auVar84._24_4_ = auVar49._24_4_ * fStack_10c8;
              auVar84._28_4_ = 0;
              auVar25 = vfmadd213ps_fma(auVar48,local_1100,auVar84);
              auVar30 = vfmadd213ps_fma(auVar68,local_1120,ZEXT1632(auVar25));
              auVar68 = vrcp14ps_avx512vl(auVar47);
              auVar46._8_4_ = 0x3f800000;
              auVar46._0_8_ = &DAT_3f8000003f800000;
              auVar46._12_4_ = 0x3f800000;
              auVar46._16_4_ = 0x3f800000;
              auVar46._20_4_ = 0x3f800000;
              auVar46._24_4_ = 0x3f800000;
              auVar46._28_4_ = 0x3f800000;
              auVar46 = vfnmadd213ps_avx512vl(auVar68,auVar47,auVar46);
              auVar25 = vfmadd132ps_fma(auVar46,auVar68,auVar68);
              local_1060 = ZEXT1632(CONCAT412((auVar30._12_4_ + auVar30._12_4_) * auVar25._12_4_,
                                              CONCAT48((auVar30._8_4_ + auVar30._8_4_) *
                                                       auVar25._8_4_,
                                                       CONCAT44((auVar30._4_4_ + auVar30._4_4_) *
                                                                auVar25._4_4_,
                                                                (auVar30._0_4_ + auVar30._0_4_) *
                                                                auVar25._0_4_))));
              uVar77 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar60._4_4_ = uVar77;
              auVar60._0_4_ = uVar77;
              auVar60._8_4_ = uVar77;
              auVar60._12_4_ = uVar77;
              auVar60._16_4_ = uVar77;
              auVar60._20_4_ = uVar77;
              auVar60._24_4_ = uVar77;
              auVar60._28_4_ = uVar77;
              uVar7 = vcmpps_avx512vl(local_1060,auVar60,0xd);
              auVar61._8_4_ = 0x80000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar61._12_4_ = 0x80000000;
              auVar61._16_4_ = 0x80000000;
              auVar61._20_4_ = 0x80000000;
              auVar61._24_4_ = 0x80000000;
              auVar61._28_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(auVar47,auVar61);
              fVar89 = (ray->super_RayK<1>).tfar;
              auVar62._4_4_ = fVar89;
              auVar62._0_4_ = fVar89;
              auVar62._8_4_ = fVar89;
              auVar62._12_4_ = fVar89;
              auVar62._16_4_ = fVar89;
              auVar62._20_4_ = fVar89;
              auVar62._24_4_ = fVar89;
              auVar62._28_4_ = fVar89;
              uVar8 = vcmpps_avx512vl(local_1060,auVar62,2);
              uVar10 = vcmpps_avx512vl(auVar47,auVar68,4);
              local_10c0 = (byte)uVar7 & (byte)uVar8 & (byte)uVar10 & local_10c0;
              uVar24 = (uint)local_10c0;
              if (local_10c0 != 0) {
                local_1180 = auVar65;
                local_fe0 = 0xf0;
                local_1298 = context->scene;
                auVar11._8_4_ = 0x219392ef;
                auVar11._0_8_ = 0x219392ef219392ef;
                auVar11._12_4_ = 0x219392ef;
                auVar11._16_4_ = 0x219392ef;
                auVar11._20_4_ = 0x219392ef;
                auVar11._24_4_ = 0x219392ef;
                auVar11._28_4_ = 0x219392ef;
                uVar22 = vcmpps_avx512vl(local_1140,auVar11,5);
                auVar46 = vrcp14ps_avx512vl(local_1140);
                auVar81._8_4_ = 0x3f800000;
                auVar81._0_8_ = &DAT_3f8000003f800000;
                auVar81._12_4_ = 0x3f800000;
                auVar81._16_4_ = 0x3f800000;
                auVar81._20_4_ = 0x3f800000;
                auVar81._24_4_ = 0x3f800000;
                auVar81._28_4_ = 0x3f800000;
                auVar25 = vfnmadd213ps_fma(local_1140,auVar46,auVar81);
                auVar68 = vfmadd132ps_avx512vl(ZEXT1632(auVar25),auVar46,auVar46);
                fVar90 = (float)((uint)((byte)uVar22 & 1) * auVar68._0_4_);
                fVar89 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar68._4_4_);
                fVar91 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar68._8_4_);
                fVar92 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar68._12_4_);
                fVar97 = (float)((uint)((byte)(uVar22 >> 4) & 1) * auVar68._16_4_);
                fVar96 = (float)((uint)((byte)(uVar22 >> 5) & 1) * auVar68._20_4_);
                fVar95 = (float)((uint)((byte)(uVar22 >> 6) & 1) * auVar68._24_4_);
                auVar13._4_4_ = fVar89 * auVar65._4_4_;
                auVar13._0_4_ = fVar90 * auVar65._0_4_;
                auVar13._8_4_ = fVar91 * auVar65._8_4_;
                auVar13._12_4_ = fVar92 * auVar65._12_4_;
                auVar13._16_4_ = fVar97 * auVar65._16_4_;
                auVar13._20_4_ = fVar96 * auVar65._20_4_;
                auVar13._24_4_ = fVar95 * auVar65._24_4_;
                auVar13._28_4_ = auVar65._28_4_;
                auVar68 = vminps_avx(auVar13,auVar81);
                auVar14._4_4_ = local_1160._4_4_ * fVar89;
                auVar14._0_4_ = local_1160._0_4_ * fVar90;
                auVar14._8_4_ = local_1160._8_4_ * fVar91;
                auVar14._12_4_ = local_1160._12_4_ * fVar92;
                auVar14._16_4_ = local_1160._16_4_ * fVar97;
                auVar14._20_4_ = local_1160._20_4_ * fVar96;
                auVar14._24_4_ = local_1160._24_4_ * fVar95;
                auVar14._28_4_ = auVar46._28_4_;
                auVar46 = vminps_avx(auVar14,auVar81);
                auVar47 = vsubps_avx(auVar81,auVar68);
                auVar50 = vsubps_avx(auVar81,auVar46);
                local_1080 = vblendps_avx(auVar46,auVar47,0xf0);
                local_10a0 = vblendps_avx(auVar68,auVar50,0xf0);
                fVar89 = (float)DAT_02060940;
                fVar90 = DAT_02060940._4_4_;
                fVar91 = DAT_02060940._8_4_;
                fVar92 = DAT_02060940._12_4_;
                fVar95 = DAT_02060940._16_4_;
                fVar96 = DAT_02060940._20_4_;
                fVar97 = DAT_02060940._24_4_;
                local_1040[0] = local_1120._0_4_ * fVar89;
                local_1040[1] = local_1120._4_4_ * fVar90;
                local_1040[2] = local_1120._8_4_ * fVar91;
                local_1040[3] = local_1120._12_4_ * fVar92;
                fStack_1030 = local_1120._16_4_ * fVar95;
                fStack_102c = local_1120._20_4_ * fVar96;
                fStack_1028 = local_1120._24_4_ * fVar97;
                uStack_1024 = local_1120._28_4_;
                local_1020[0] = local_1100._0_4_ * fVar89;
                local_1020[1] = local_1100._4_4_ * fVar90;
                local_1020[2] = local_1100._8_4_ * fVar91;
                local_1020[3] = local_1100._12_4_ * fVar92;
                fStack_1010 = local_1100._16_4_ * fVar95;
                fStack_100c = local_1100._20_4_ * fVar96;
                fStack_1008 = local_1100._24_4_ * fVar97;
                uStack_1004 = local_1100._28_4_;
                local_1000[0] = local_10e0 * fVar89;
                local_1000[1] = fStack_10dc * fVar90;
                local_1000[2] = fStack_10d8 * fVar91;
                local_1000[3] = fStack_10d4 * fVar92;
                fStack_ff0 = fStack_10d0 * fVar95;
                fStack_fec = fStack_10cc * fVar96;
                fStack_fe8 = fStack_10c8 * fVar97;
                uStack_fe4 = uStack_10c4;
                auVar70._8_4_ = 0x7f800000;
                auVar70._0_8_ = 0x7f8000007f800000;
                auVar70._12_4_ = 0x7f800000;
                auVar70._16_4_ = 0x7f800000;
                auVar70._20_4_ = 0x7f800000;
                auVar70._24_4_ = 0x7f800000;
                auVar70._28_4_ = 0x7f800000;
                auVar68 = vblendmps_avx512vl(auVar70,local_1060);
                auVar69._0_4_ =
                     (uint)(local_10c0 & 1) * auVar68._0_4_ |
                     (uint)!(bool)(local_10c0 & 1) * 0x7f800000;
                bVar5 = (bool)(local_10c0 >> 1 & 1);
                auVar69._4_4_ = (uint)bVar5 * auVar68._4_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)(local_10c0 >> 2 & 1);
                auVar69._8_4_ = (uint)bVar5 * auVar68._8_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)(local_10c0 >> 3 & 1);
                auVar69._12_4_ = (uint)bVar5 * auVar68._12_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)(local_10c0 >> 4 & 1);
                auVar69._16_4_ = (uint)bVar5 * auVar68._16_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)(local_10c0 >> 5 & 1);
                auVar69._20_4_ = (uint)bVar5 * auVar68._20_4_ | (uint)!bVar5 * 0x7f800000;
                bVar5 = (bool)(local_10c0 >> 6 & 1);
                auVar69._24_4_ = (uint)bVar5 * auVar68._24_4_ | (uint)!bVar5 * 0x7f800000;
                auVar69._28_4_ =
                     (uint)(local_10c0 >> 7) * auVar68._28_4_ |
                     (uint)!(bool)(local_10c0 >> 7) * 0x7f800000;
                auVar68 = vshufps_avx(auVar69,auVar69,0xb1);
                auVar68 = vminps_avx(auVar69,auVar68);
                auVar46 = vshufpd_avx(auVar68,auVar68,5);
                auVar68 = vminps_avx(auVar68,auVar46);
                auVar46 = vpermpd_avx2(auVar68,0x4e);
                auVar68 = vminps_avx(auVar68,auVar46);
                uVar7 = vcmpps_avx512vl(auVar69,auVar68,0);
                uVar19 = uVar24;
                if (((byte)uVar7 & local_10c0) != 0) {
                  uVar19 = (uint)((byte)uVar7 & local_10c0);
                }
                bVar16 = 0;
                for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
                  bVar16 = bVar16 + 1;
                }
                local_1260 = local_1060;
                do {
                  uVar19 = *(uint *)((long)&local_fc0 + (ulong)bVar16 * 4);
                  pGVar2 = (local_1298->geometries).items[uVar19].ptr;
                  if ((pGVar2->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar24 = (uint)(byte)(~(byte)(1 << (bVar16 & 0x1f)) & (byte)uVar24);
LAB_01f4e126:
                    bVar5 = true;
                  }
                  else {
                    pRVar3 = context->args;
                    if ((pRVar3->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar2->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      uVar22 = (ulong)((uint)bVar16 * 4);
                      local_1318.context = context->user;
                      local_1290 = *(float *)((long)local_1040 + uVar22);
                      local_128c = *(undefined4 *)((long)local_1020 + uVar22);
                      local_1288 = *(undefined4 *)((long)local_1000 + uVar22);
                      local_1284 = *(undefined4 *)(local_10a0 + uVar22);
                      local_1280 = *(undefined4 *)(local_1080 + uVar22);
                      local_127c = *(undefined4 *)((long)&local_11a0 + uVar22);
                      local_1278 = uVar19;
                      local_1274 = (local_1318.context)->instID[0];
                      local_1270 = (local_1318.context)->instPrimID[0];
                      fVar89 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar22);
                      local_131c = -1;
                      local_1318.valid = &local_131c;
                      local_1318.geometryUserPtr = pGVar2->userPtr;
                      local_1318.ray = (RTCRayN *)ray;
                      local_1318.hit = (RTCHitN *)&local_1290;
                      local_1318.N = 1;
                      if ((pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar2->intersectionFilterN)(&local_1318), *local_1318.valid != 0)) {
                        if (pRVar3->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar3->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar2->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar3->filter)(&local_1318);
                          }
                          if (*local_1318.valid == 0) goto LAB_01f4e305;
                        }
                        (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_1318.hit;
                        (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_1318.hit + 4);
                        (((Vec3f *)((long)local_1318.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_1318.hit + 8);
                        *(float *)((long)local_1318.ray + 0x3c) = *(float *)(local_1318.hit + 0xc);
                        *(float *)((long)local_1318.ray + 0x40) = *(float *)(local_1318.hit + 0x10);
                        *(float *)((long)local_1318.ray + 0x44) = *(float *)(local_1318.hit + 0x14);
                        *(float *)((long)local_1318.ray + 0x48) = *(float *)(local_1318.hit + 0x18);
                        *(float *)((long)local_1318.ray + 0x4c) = *(float *)(local_1318.hit + 0x1c);
                        *(float *)((long)local_1318.ray + 0x50) = *(float *)(local_1318.hit + 0x20);
                      }
                      else {
LAB_01f4e305:
                        (ray->super_RayK<1>).tfar = fVar89;
                      }
                      fVar89 = (ray->super_RayK<1>).tfar;
                      auVar12._4_4_ = fVar89;
                      auVar12._0_4_ = fVar89;
                      auVar12._8_4_ = fVar89;
                      auVar12._12_4_ = fVar89;
                      auVar12._16_4_ = fVar89;
                      auVar12._20_4_ = fVar89;
                      auVar12._24_4_ = fVar89;
                      auVar12._28_4_ = fVar89;
                      uVar7 = vcmpps_avx512vl(local_1260,auVar12,2);
                      uVar24 = (uint)(byte)(~(byte)(1 << (bVar16 & 0x1f)) & (byte)uVar24) &
                               (uint)uVar7;
                      goto LAB_01f4e126;
                    }
                    bVar5 = false;
                  }
                  in_R10 = local_12e0;
                  uVar22 = local_12e8;
                  if (!bVar5) {
                    uVar21 = (ulong)bVar16;
                    lVar23 = uVar21 * 4;
                    fVar89 = *(float *)(local_10a0 + lVar23);
                    fVar90 = *(float *)(local_1080 + lVar23);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1060 + lVar23);
                    (ray->Ng).field_0.field_0.x = local_1040[uVar21];
                    (ray->Ng).field_0.field_0.y = local_1020[uVar21];
                    (ray->Ng).field_0.field_0.z = local_1000[uVar21];
                    ray->u = fVar89;
                    ray->v = fVar90;
                    ray->primID = *(uint *)((long)&local_11a0 + lVar23);
                    ray->geomID = uVar19;
                    pRVar4 = context->user;
                    ray->instID[0] = pRVar4->instID[0];
                    ray->instPrimID[0] = pRVar4->instPrimID[0];
                    break;
                  }
                  if ((char)uVar24 == '\0') break;
                  BVHNIntersector1<4,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  bVar16 = (byte)local_1318.valid;
                } while( true );
              }
            }
            local_12a0 = local_12a0 + 1;
          } while (local_12a0 != local_12d8);
        }
        fVar89 = (ray->super_RayK<1>).tfar;
        auVar71 = ZEXT1664(CONCAT412(fVar89,CONCAT48(fVar89,CONCAT44(fVar89,fVar89))));
        auVar86 = ZEXT1664(local_11b0);
        auVar87 = ZEXT1664(local_11c0);
        auVar88 = ZEXT1664(local_11d0);
        auVar93 = ZEXT1664(local_11f0);
        auVar94 = ZEXT1664(local_1200);
        auVar99 = ZEXT1664(local_1220);
        auVar100 = ZEXT1664(local_1230);
        auVar101 = ZEXT1664(local_1240);
        fVar89 = local_11e0;
        fVar90 = fStack_11dc;
        fVar91 = fStack_11d8;
        fVar92 = fStack_11d4;
        fVar95 = local_1210;
        fVar96 = fStack_120c;
        fVar97 = fStack_1208;
        fVar98 = fStack_1204;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }